

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VLinearCombinationVectorArray(N_Vector V,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  timespec spec;
  N_Vector *X [3];
  int local_98;
  timespec local_88;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  double local_38;
  
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,V);
  puVar5 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_78 = puVar5;
  local_70 = (undefined8 *)N_VCloneVectorArray(3,V);
  local_68 = (undefined8 *)N_VCloneVectorArray(3,V);
  N_VConst(0,*puVar5);
  local_58 = 0x4000000000000000;
  local_98 = 1;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(1,1,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  local_38 = (double)local_88.tv_nsec / 1000000000.0 + (double)(local_88.tv_sec - base_time_tv_sec);
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,(N_Vector)*local_78,param_2);
    if (iVar1 != 0) goto LAB_0010d0e9;
    local_98 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 1a ");
    }
  }
  else {
LAB_0010d0e9:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1a, Proc %d \n",
           (ulong)(uint)myid);
  }
  dVar8 = max_time(V,local_38 - (dVar8 / 1000000000.0 + (double)lVar6));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*puVar4);
  local_58 = 0x4000000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(1,1,&local_58,&local_78,puVar4);
  sync_device(V);
  clock_gettime(1,&local_88);
  local_38 = (double)local_88.tv_nsec / 1000000000.0 + (double)(local_88.tv_sec - base_time_tv_sec);
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,(N_Vector)*puVar4,param_2);
    if (iVar1 != 0) goto LAB_0010d230;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 1b ");
    }
  }
  else {
LAB_0010d230:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1b, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,local_38 - (dVar8 / 1000000000.0 + (double)lVar6));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  local_58 = 0x4000000000000000;
  uStack_50 = 0xbff0000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(1,2,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,(N_Vector)*local_78,param_2);
    if (iVar1 != 0) goto LAB_0010d384;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 2a ");
    }
  }
  else {
LAB_0010d384:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2a, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  local_58 = 0x4000000000000000;
  uStack_50 = 0xbff0000000000000;
  N_VConst(0,*puVar4);
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(1,2,&local_58,&local_78,puVar4);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,(N_Vector)*puVar4,param_2);
    if (iVar1 != 0) goto LAB_0010d4dd;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 2b ");
    }
  }
  else {
LAB_0010d4dd:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2b, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  local_58 = 0x4000000000000000;
  uStack_50 = 0x3fe0000000000000;
  local_48 = 0xbff0000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(1,3,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,(N_Vector)*local_78,param_2);
    if (iVar1 != 0) goto LAB_0010d653;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 3a ");
    }
  }
  else {
LAB_0010d653:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3a, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  local_58 = 0x4000000000000000;
  uStack_50 = 0x3fe0000000000000;
  local_48 = 0xbff0000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(1,3,&local_58,&local_78,puVar4);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,(N_Vector)*puVar4,param_2);
    if (iVar1 != 0) goto LAB_0010d7c3;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 3b ");
    }
  }
  else {
LAB_0010d7c3:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3b, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_78[2]);
  local_58 = 0x3fe0000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,1,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(-1.0,(N_Vector)*local_78,param_2);
    iVar2 = check_ans(-0.5,(N_Vector)local_78[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)local_78[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010d97f;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 4a ");
    }
  }
  else {
LAB_0010d97f:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4a, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_78[2]);
  local_58 = 0x3fe0000000000000;
  N_VConst(0,*puVar4);
  N_VConst(0,puVar4[1]);
  N_VConst(0,puVar4[2]);
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,1,&local_58,&local_78,puVar4);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(-1.0,(N_Vector)*puVar4,param_2);
    iVar2 = check_ans(-0.5,(N_Vector)puVar4[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)puVar4[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010db4a;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 4b ");
    }
  }
  else {
LAB_0010db4a:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4b, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_70[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0,local_70[2]);
  local_58 = 0x3fe0000000000000;
  uStack_50 = 0x4000000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,2,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(3.0,(N_Vector)*local_78,param_2);
    iVar2 = check_ans(2.0,(N_Vector)local_78[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)local_78[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010dd3a;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 5a ");
    }
  }
  else {
LAB_0010dd3a:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5a, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_70[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0,local_70[2]);
  local_58 = 0x3fe0000000000000;
  uStack_50 = 0x4000000000000000;
  N_VConst(0,*puVar4);
  N_VConst(0,puVar4[1]);
  N_VConst(0,puVar4[2]);
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,2,&local_58,&local_78,puVar4);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(3.0,(N_Vector)*puVar4,param_2);
    iVar2 = check_ans(2.0,(N_Vector)puVar4[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)puVar4[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010df3c;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 5b ");
    }
  }
  else {
LAB_0010df3c:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5b, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_70[1]);
  N_VConst(0,local_68[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0,local_70[2]);
  N_VConst(0,local_68[2]);
  local_58 = 0x3ff0000000000000;
  uStack_50 = 0xbfe0000000000000;
  local_48 = 0xbff0000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,3,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(4.0,(N_Vector)*local_78,param_2);
    iVar2 = check_ans(-1.0,(N_Vector)local_78[1],param_2);
    iVar3 = check_ans(-4.0,(N_Vector)local_78[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010e17d;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 6a ");
    }
  }
  else {
LAB_0010e17d:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6a, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_70[1]);
  N_VConst(0,local_68[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0,local_70[2]);
  N_VConst(0,local_68[2]);
  local_58 = 0x4000000000000000;
  uStack_50 = 0x3fe0000000000000;
  local_48 = 0xbff0000000000000;
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,3,&local_58,&local_78,local_78);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,(N_Vector)*local_78,param_2);
    iVar2 = check_ans(-2.0,(N_Vector)local_78[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)local_78[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010e3be;
    if (myid == 0) {
      puts("PASSED test -- N_VLinearCombinationVectorArray Case 6b ");
    }
  }
  else {
LAB_0010e3be:
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6b, Proc %d \n",
           (ulong)(uint)myid);
    local_98 = local_98 + 1;
  }
  dVar8 = max_time(V,(dVar8 / 1000000000.0 + (double)lVar7) - (dVar9 / 1000000000.0 + (double)lVar6)
                  );
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VConst(0,*local_78);
  N_VConst(0,*local_70);
  N_VConst(0,*local_68);
  N_VConst(0,local_78[1]);
  N_VConst(0,local_70[1]);
  N_VConst(0,local_68[1]);
  N_VConst(0,local_78[2]);
  N_VConst(0,local_70[2]);
  N_VConst(0,local_68[2]);
  local_58 = 0x4000000000000000;
  uStack_50 = 0x3fe0000000000000;
  local_48 = 0xbff0000000000000;
  N_VConst(0,*puVar4);
  N_VConst(0,puVar4[1]);
  N_VConst(0,puVar4[2]);
  clock_gettime(1,&local_88);
  lVar6 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  iVar1 = N_VLinearCombinationVectorArray(3,3,&local_58,&local_78,puVar4);
  sync_device(V);
  clock_gettime(1,&local_88);
  lVar7 = local_88.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    iVar1 = check_ans(2.0,(N_Vector)*puVar4,param_2);
    iVar2 = check_ans(-2.0,(N_Vector)puVar4[1],param_2);
    iVar3 = check_ans(1.0,(N_Vector)puVar4[2],param_2);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VLinearCombinationVectorArray Case 6c ");
      }
      goto LAB_0010e626;
    }
  }
  printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6c, Proc %d \n",(ulong)(uint)myid)
  ;
  local_98 = local_98 + 1;
LAB_0010e626:
  dVar8 = max_time(V,((double)local_88.tv_nsec / 1000000000.0 + (double)lVar7) -
                     (dVar8 / 1000000000.0 + (double)lVar6));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar8,0),"N_VLinearCombinationVectorArray");
  }
  N_VDestroyVectorArray(puVar4,3);
  N_VDestroyVectorArray(local_78,3);
  N_VDestroyVectorArray(local_70,3);
  N_VDestroyVectorArray(local_68,3);
  return local_98;
}

Assistant:

int Test_N_VLinearCombinationVectorArray(N_Vector V, sunindextype local_length,
                                         int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype c[3];
  N_Vector* Z;
  N_Vector* X[3];

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, V);

  X[0] = N_VCloneVectorArray(3, V);
  X[1] = N_VCloneVectorArray(3, V);
  X[2] = N_VCloneVectorArray(3, V);

  /*
   * Case 1a: (nvec = 1, nsum = 1), N_VScale
   * X[0][0] = c[0] X[0][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 1, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +1 */
  if (ierr == 0) { failure = check_ans(ONE, X[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 1b: (nvec = 1, nsum = 1), N_VScale
   * Z[0] = c[0] X[0][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  N_VConst(ZERO, Z[0]);
  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 1, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 1b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 2a: (nvec = 1, nsum = 2), N_VLinearSum
   * X[0][0] = c[0] X[0][0] + c[1] X[1][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  N_VConst(NEG_ONE, X[1][0]);

  c[0] = TWO;
  c[1] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 2, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, X[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 2b: (nvec = 1, nsum = 2), N_VLinearSum
   * Z[0] = c[0] X[0][0] + c[1] X[1][0]
   */

  /* fill vector data and scaling factor */
  N_VConst(HALF, X[0][0]);
  N_VConst(NEG_ONE, X[1][0]);

  c[0] = TWO;
  c[1] = NEG_ONE;

  N_VConst(ZERO, Z[0]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 2, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 2b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 3a: (nvec = 1, nsum > 2), N_VLinearCombination
   * X[0][0] = c[0] X[0][0] + c[1] X[1][0] + c[2] X[2][0]
   */

  /* fill vector data */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  /* set scaling factors */
  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 3, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, X[0][0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 3b: (nvec = 1, nsum > 2), N_VLinearCombination
   * Z[0] = c[0] X[0][0] + c[1] X[1][0] + c[2] X[2][0]
   */

  /* fill vector data */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  /* set scaling factors */
  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(1, 3, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[0] should equal +2 */
  if (ierr == 0) { failure = check_ans(TWO, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 3b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 4a: (nvec > 1, nsum = 1), N_VScaleVectorArray
   * X[0][i] = c[0] X[0][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[0][2]);

  c[0] = HALF;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 1, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to -1, -1/2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, X[0][0], local_length);
    failure += check_ans(NEG_HALF, X[0][1], local_length);
    failure += check_ans(ONE, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 4a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 4b: (nvec > 1, nsum = 1), N_VScaleVectorArray
   * Z[i] = c[0] X[0][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[0][2]);

  c[0] = HALF;

  N_VConst(ZERO, Z[0]);
  N_VConst(ZERO, Z[1]);
  N_VConst(ZERO, Z[2]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 1, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to -1, -1/2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0], local_length);
    failure += check_ans(NEG_HALF, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 4b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 4b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 5a: (nvec > 1, nsum = 2), N_VLinearSumVectorArray
   * X[0][i] = c[0] X[0][i] + c[1] X[1][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(TWO, X[1][0]);

  N_VConst(TWO, X[0][1]);
  N_VConst(HALF, X[1][1]);

  N_VConst(ZERO, X[0][2]);
  N_VConst(HALF, X[1][2]);

  c[0] = HALF;
  c[1] = TWO;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 2, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +3, +2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(ONE + TWO, X[0][0], local_length);
    failure += check_ans(TWO, X[0][1], local_length);
    failure += check_ans(ONE, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 5a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 5b: (nvec > 1, nsum = 2), N_VLinearSumVectorArray
   * Z[0] = c[0] X[0][i] + c[1] X[1][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(NEG_TWO, X[0][0]);
  N_VConst(TWO, X[1][0]);

  N_VConst(TWO, X[0][1]);
  N_VConst(HALF, X[1][1]);

  N_VConst(ZERO, X[0][2]);
  N_VConst(HALF, X[1][2]);

  c[0] = HALF;
  c[1] = TWO;

  N_VConst(ZERO, Z[0]);
  N_VConst(ZERO, Z[1]);
  N_VConst(ZERO, Z[2]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 2, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +3, +2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(ONE + TWO, Z[0], local_length);
    failure += check_ans(TWO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 5b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 5b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 6a: (nvec > 1, nsum > 2)
   * X[0][i] += c[1] X[1][i] + c[2] X[2][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(TWO, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  N_VConst(ONE, X[0][1]);
  N_VConst(TWO, X[1][1]);
  N_VConst(ONE, X[2][1]);

  N_VConst(NEG_ONE, X[0][2]);
  N_VConst(TWO, X[1][2]);
  N_VConst(TWO, X[2][2]);

  c[0] = ONE;
  c[1] = NEG_HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 3, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +4, -1, -4 */
  if (ierr == 0)
  {
    failure = check_ans(TWO + TWO, X[0][0], local_length);
    failure += check_ans(NEG_ONE, X[0][1], local_length);
    failure += check_ans(-TWO - TWO, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6a, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 6a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 6b: (nvec > 1, nsum > 2)
   * X[0][i] = c[0] X[0][i] + c[1] X[1][i] + c[2] X[2][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[1][1]);
  N_VConst(ONE, X[2][1]);

  N_VConst(HALF, X[0][2]);
  N_VConst(TWO, X[1][2]);
  N_VConst(ONE, X[2][2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 3, c, X, X[0]);
  sync_device(V);
  stop_time = get_time();

  /* X[0][i] should equal to +2, -2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(TWO, X[0][0], local_length);
    failure += check_ans(NEG_TWO, X[0][1], local_length);
    failure += check_ans(ONE, X[0][2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6b, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 6b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /*
   * Case 6c: (nvec > 1, nsum > 2)
   * Z[i] = c[0] X[0][i] + c[1] X[1][i] + c[2] X[2][i]
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X[0][0]);
  N_VConst(NEG_TWO, X[1][0]);
  N_VConst(NEG_ONE, X[2][0]);

  N_VConst(NEG_ONE, X[0][1]);
  N_VConst(TWO, X[1][1]);
  N_VConst(ONE, X[2][1]);

  N_VConst(HALF, X[0][2]);
  N_VConst(TWO, X[1][2]);
  N_VConst(ONE, X[2][2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_ONE;

  N_VConst(ZERO, Z[0]);
  N_VConst(ZERO, Z[1]);
  N_VConst(ZERO, Z[2]);

  start_time = get_time();
  ierr       = N_VLinearCombinationVectorArray(3, 3, c, X, Z);
  sync_device(V);
  stop_time = get_time();

  /* Z[i] should equal to +2, -2, +1 */
  if (ierr == 0)
  {
    failure = check_ans(TWO, Z[0], local_length);
    failure += check_ans(NEG_TWO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VLinearCombinationVectorArray Case 6c, Proc "
           "%d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VLinearCombinationVectorArray Case 6c \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VLinearCombinationVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(X[0], 3);
  N_VDestroyVectorArray(X[1], 3);
  N_VDestroyVectorArray(X[2], 3);

  return (fails);
}